

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::NonPackedFixed32::_InternalSerialize
          (NonPackedFixed32 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  int iVar2;
  const_reference puVar3;
  ulong uVar4;
  uint8_t *puVar5;
  int index;
  
  iVar2 = google::protobuf::internal::SooRep::size
                    ((SooRep *)&(this->field_0)._impl_,
                     (undefined1  [24])((undefined1  [24])this->field_0 & (undefined1  [24])0x4) ==
                     (undefined1  [24])0x0);
  if (0 < iVar2) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar3 = google::protobuf::RepeatedField<unsigned_int>::Get
                         (&(this->field_0)._impl_.repeated_fixed32_,index);
      uVar1 = *puVar3;
      target[0] = 0x85;
      target[1] = 0x80;
      target[2] = '\x01';
      *(uint *)(target + 3) = uVar1;
      target = target + 7;
      index = index + 1;
    } while (iVar2 != index);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffe;
    data = *(void **)(uVar4 + 8);
    uVar1 = *(uint *)(uVar4 + 0x10);
    if ((long)stream->end_ - (long)target < (long)(int)uVar1) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,uVar1,target)
      ;
      return puVar5;
    }
    memcpy(target,data,(ulong)uVar1);
    target = target + (int)uVar1;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL NonPackedFixed32::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const NonPackedFixed32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.NonPackedFixed32)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated fixed32 repeated_fixed32 = 2048;
  for (int i = 0, n = this_._internal_repeated_fixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        2048, this_._internal_repeated_fixed32().Get(i), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.NonPackedFixed32)
  return target;
}